

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::MethodDescriptorProto::SharedDtor(MethodDescriptorProto *this)

{
  MethodOptions *this_00;
  void *pvVar1;
  LogMessage *other;
  LogMessage local_58;
  LogFinisher local_19;
  
  pvVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    pvVar1 = *(void **)((ulong)pvVar1 & 0xfffffffffffffffe);
  }
  if (pvVar1 != (void *)0x0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/descriptor.pb.cc"
               ,0x16e4);
    other = internal::LogMessage::operator<<(&local_58,"CHECK failed: GetArena() == nullptr: ");
    internal::LogFinisher::operator=(&local_19,other);
    internal::LogMessage::~LogMessage(&local_58);
  }
  internal::ArenaStringPtr::DestroyNoArena
            (&this->name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  internal::ArenaStringPtr::DestroyNoArena
            (&this->input_type_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  internal::ArenaStringPtr::DestroyNoArena
            (&this->output_type_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  if (this != (MethodDescriptorProto *)_MethodDescriptorProto_default_instance_) {
    this_00 = this->options_;
    if (this_00 != (MethodOptions *)0x0) {
      MethodOptions::~MethodOptions(this_00);
    }
    operator_delete(this_00);
  }
  return;
}

Assistant:

void MethodDescriptorProto::SharedDtor() {
  GOOGLE_DCHECK(GetArena() == nullptr);
  name_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  input_type_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  output_type_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (this != internal_default_instance()) delete options_;
}